

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

tuple<unsigned_long,_unsigned_long> __thiscall
qclab::qgates::masks(qgates *this,int nbQubits,int qubit)

{
  _Head_base<0UL,_unsigned_long,_false> extraout_RDX;
  tuple<unsigned_long,_unsigned_long> tVar1;
  unsigned_long local_30;
  uint64_t mR;
  uint64_t mL;
  int nR;
  int nL;
  int qubit_local;
  int nbQubits_local;
  
  nR = qubit;
  nL = nbQubits;
  _qubit_local = this;
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/apply.hpp"
                  ,0xe5,"std::tuple<uint64_t, uint64_t> qclab::qgates::masks(const int, const int)")
    ;
  }
  if (qubit < nbQubits) {
    mL._0_4_ = (nbQubits - qubit) + -1;
    mR = (1L << ((byte)qubit & 0x3f)) + -1 << ((byte)(int)mL & 0x3f);
    local_30 = (1L << ((byte)(int)mL & 0x3f)) - 1;
    mL._4_4_ = qubit;
    std::tuple<unsigned_long,_unsigned_long>::tuple<true,_true>
              ((tuple<unsigned_long,_unsigned_long> *)this,&mR,&local_30);
    tVar1.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = extraout_RDX._M_head_impl;
    tVar1.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>
    .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
    return (tuple<unsigned_long,_unsigned_long>)
           tVar1.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>;
  }
  __assert_fail("qubit < nbQubits",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xe6,"std::tuple<uint64_t, uint64_t> qclab::qgates::masks(const int, const int)");
}

Assistant:

inline
  std::tuple< uint64_t , uint64_t > masks( const int nbQubits ,
                                           const int qubit ) {
    assert( nbQubits >= 1 ) ;
    assert( qubit < nbQubits ) ;
    // mask lengths
    const int nL = qubit ;
    const int nR = nbQubits - qubit - 1 ;
    // masks
    const uint64_t mL = ( ( 1ULL << nL ) - 1 ) << nR ;
    const uint64_t mR =   ( 1ULL << nR ) - 1 ;
    return { mL , mR } ;
  }